

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O3

obj * add_to_magic_chest(obj *obj)

{
  int iVar1;
  undefined4 extraout_var;
  obj *in_RDI;
  obj *local_28;
  obj *local_20;
  
  if ((int)in_RDI->where != 0) {
    panic("add_to_magic_chest: obj not free (%d,%d,%d)",(ulong)(uint)(int)in_RDI->where,
          (ulong)(uint)(int)in_RDI->otyp,(ulong)(uint)(int)in_RDI->invlet);
  }
  local_28 = magic_chest_objs;
  local_20 = in_RDI;
  if (magic_chest_objs == (obj *)0x0) {
    magic_chest_objs = (obj *)0x0;
  }
  else {
    do {
      iVar1 = merged(&local_28,&local_20);
      if (iVar1 != 0) {
        return (obj *)CONCAT44(extraout_var,iVar1);
      }
      local_28 = local_28->nobj;
    } while (local_28 != (obj *)0x0);
  }
  local_20->where = '\a';
  local_20->nobj = magic_chest_objs;
  magic_chest_objs = local_20;
  return local_20;
}

Assistant:

static struct obj *add_to_magic_chest(struct obj *obj)
{
    struct obj *otmp;

    if (obj->where != OBJ_FREE) {
	panic("add_to_magic_chest: obj not free (%d,%d,%d)",
	      obj->where, obj->otyp, obj->invlet);
    }

    /* merge if possible */
    for (otmp = magic_chest_objs; otmp; otmp = otmp->nobj)
	if (merged(&otmp, &obj)) return otmp;

    obj->where = OBJ_MAGIC_CHEST;
    obj->nobj = magic_chest_objs;
    magic_chest_objs = obj;
    return obj;
}